

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O2

void hta::storage::file::check(path *dir,bool fast)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  size_type sVar3;
  TimePoint time;
  TimePoint time_00;
  duration dVar4;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tVar5;
  char *__nbytes;
  undefined7 in_register_00000031;
  char *pcVar6;
  Duration interval;
  path raw_path;
  path hta_path;
  string local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  File<hta::storage::file::Metric::Header,_hta::TimeValue> raw_file;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> hta_file;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"[");
  pbVar2 = std::filesystem::__cxx11::operator<<(poVar1,dir);
  poVar1 = std::operator<<(pbVar2,"] Checking metric directory ");
  __nbytes = " fast";
  pcVar6 = " full";
  if ((int)CONCAT71(in_register_00000031,fast) != 0) {
    pcVar6 = " fast";
  }
  poVar1 = std::operator<<(poVar1,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            (&raw_file.filename_,(char (*) [8])"raw.hta",auto_format);
  std::filesystem::__cxx11::operator/(&raw_path,dir,&raw_file.filename_);
  std::filesystem::__cxx11::path::~path(&raw_file.filename_);
  poVar1 = std::operator<<((ostream *)&std::cout,"[");
  pbVar2 = std::filesystem::__cxx11::operator<<(poVar1,&raw_path);
  poVar1 = std::operator<<(pbVar2,"] Checking raw file");
  std::endl<char,std::char_traits<char>>(poVar1);
  File<hta::storage::file::Metric::Header,_hta::TimeValue>::File(&raw_file);
  sVar3 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::size(&raw_file);
  if (sVar3 == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"[");
    pbVar2 = std::filesystem::__cxx11::operator<<(poVar1,&raw_path);
    poVar1 = std::operator<<(pbVar2,"] Warning: empty raw file, aborting check.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    time.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
    __d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
              File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                        (&raw_file,0,(void *)0x0,(size_t)__nbytes);
    sVar3 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::size(&raw_file);
    time_00.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                         (&raw_file,(int)sVar3 + -1,(void *)0x0,(size_t)__nbytes);
    if ((long)time_00.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <
        (long)time.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"[");
      pbVar2 = std::filesystem::__cxx11::operator<<(poVar1,&raw_path);
      poVar1 = std::operator<<(pbVar2,"] Error: First after last raw timestamp: ");
      std::ostream::_M_insert<long>((long)poVar1);
      poVar1 = std::operator<<(poVar1,", ");
      std::ostream::_M_insert<long>((long)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if ((long)future.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <
        (long)time.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r ||
        (long)time.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r < 0xd234ccf52430000) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"[");
      pbVar2 = std::filesystem::__cxx11::operator<<(poVar1,&raw_path);
      poVar1 = std::operator<<(pbVar2,"] Error: Implausible first raw timestamp: ");
      std::ostream::_M_insert<long>((long)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    if (((long)time_00.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r < 0xd234ccf52430000) ||
       ((long)future.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <
        (long)time_00.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r)) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"[");
      pbVar2 = std::filesystem::__cxx11::operator<<(poVar1,&raw_path);
      poVar1 = std::operator<<(pbVar2,"] Error: Implausible last raw timestamp: ");
      std::ostream::_M_insert<long>((long)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    check_raw(&raw_file,fast);
    for (interval.__r = raw_file.header_.interval_min; interval.__r <= raw_file.header_.interval_max
        ; interval.__r = interval.__r * raw_file.header_.interval_factor) {
      std::__cxx11::to_string(&local_570,interval.__r);
      std::operator+(&local_550,&local_570,".hta");
      std::filesystem::__cxx11::path::path(&hta_file.filename_,&local_550,auto_format);
      std::filesystem::__cxx11::operator/(&hta_path,dir,&hta_file.filename_);
      std::filesystem::__cxx11::path::~path(&hta_file.filename_);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::string::~string((string *)&local_570);
      poVar1 = std::operator<<((ostream *)&std::cout,"[");
      pbVar2 = std::filesystem::__cxx11::operator<<(poVar1,&hta_path);
      poVar1 = std::operator<<(pbVar2,"] Checking HTA file");
      std::endl<char,std::char_traits<char>>(poVar1);
      File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::File(&hta_file,&hta_path);
      if (interval.__r != hta_file.header_.interval) {
        poVar1 = std::operator<<((ostream *)&std::cerr,"[");
        pbVar2 = std::filesystem::__cxx11::operator<<(poVar1,&hta_path);
        poVar1 = std::operator<<(pbVar2,"] Error: ");
        poVar1 = std::operator<<(poVar1," mismatching interval: name: ");
        std::ostream::_M_insert<long>((long)poVar1);
        poVar1 = std::operator<<(poVar1,", header: ");
        poVar1 = std::ostream::_M_insert<long>((long)poVar1);
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      dVar4.__r = (rep)interval_begin(time,interval);
      tVar5.__d.__r = (duration)interval_begin(time_00,interval);
      if ((duration)dVar4.__r == tVar5.__d.__r) {
        sVar3 = File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::size(&hta_file);
        if (sVar3 != 0) {
          poVar1 = std::operator<<((ostream *)&std::cerr,
                                   "Top HTA file should be empty but it is not.");
          std::endl<char,std::char_traits<char>>(poVar1);
        }
      }
      else {
        check_hta(&hta_file,interval,time,time_00,fast);
      }
      File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::~File(&hta_file);
      std::filesystem::__cxx11::path::~path(&hta_path);
      if ((duration)dVar4.__r == tVar5.__d.__r) break;
    }
  }
  File<hta::storage::file::Metric::Header,_hta::TimeValue>::~File(&raw_file);
  std::filesystem::__cxx11::path::~path(&raw_path);
  return;
}

Assistant:

void check(const std::filesystem::path dir, bool fast = false)
{
    std::cout << "[" << dir << "] Checking metric directory " << (fast ? " fast" : " full")
              << std::endl;

    auto raw_path = dir / std::filesystem::path("raw.hta");
    std::cout << "[" << raw_path << "] Checking raw file" << std::endl;
    File<Metric::Header, TimeValue> raw_file{ FileOpenTag::Read(), raw_path };

    if (raw_file.size() == 0)
    {
        std::cout << "[" << raw_path << "] Warning: empty raw file, aborting check." << std::endl;
        return;
    }
    auto raw_epoch = raw_file.read(0).time;
    auto raw_end = raw_file.read(raw_file.size() - 1).time;

    if (raw_epoch > raw_end)
    {
        std::cerr << "[" << raw_path << "] Error: First after last raw timestamp: " << raw_epoch
                  << ", " << raw_end << std::endl;
    }

    if (raw_epoch < genesis || raw_epoch > future)
    {
        std::cerr << "[" << raw_path << "] Error: Implausible first raw timestamp: " << raw_epoch
                  << std::endl;
    }

    if (raw_end < genesis || raw_end > future)
    {
        std::cerr << "[" << raw_path << "] Error: Implausible last raw timestamp: " << raw_end
                  << std::endl;
    }

    auto header = raw_file.header();
    check_raw(raw_file, fast);

    for (auto interval = Duration(header.interval_min); interval.count() <= header.interval_max;
         interval *= header.interval_factor)
    {

        auto hta_path = dir / (std::to_string(interval.count()) + ".hta");
        std::cout << "[" << hta_path << "] Checking HTA file" << std::endl;
        File<Metric::Header, TimeAggregate> hta_file{ FileOpenTag::Read(), hta_path };
        if (interval.count() != hta_file.header().interval)
        {
            std::cerr << "[" << hta_path << "] Error: "
                      << " mismatching interval: name: " << interval
                      << ", header: " << hta_file.header().interval << std::endl;
        }

        if (interval_begin(raw_epoch, interval) == interval_begin(raw_end, interval))
        {
            if (hta_file.size() != 0)
            {
                std::cerr << "Top HTA file should be empty but it is not." << std::endl;
            }
            break;
        }

        // TODO Check interval factor/min
        check_hta(hta_file, interval, raw_epoch, raw_end, fast);
    }
}